

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsFontScaler.cpp
# Opt level: O0

void __thiscall KDReports::FontScaler::setFactorForHeight(FontScaler *this,qreal wantedHeight)

{
  int iVar1;
  double dVar2;
  qreal prevHeight;
  qreal factor;
  double dStack_20;
  int iterations;
  qreal height;
  qreal wantedHeight_local;
  FontScaler *this_local;
  
  if (wantedHeight <= 0.0) {
    qt_assert("wantedHeight > 0",
              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsFontScaler.cpp"
              ,0x52);
  }
  dStack_20 = (double)QFontMetricsF::height();
  factor._4_4_ = 0;
  do {
    if (dStack_20 <= wantedHeight || dStack_20 <= 3.0) {
      return;
    }
    applyAdditionalScalingFactor(this,wantedHeight / dStack_20);
    dVar2 = (double)QFontMetricsF::height();
    factor._4_4_ = factor._4_4_ + 1;
    if (10 < factor._4_4_) {
      if ((dVar2 == dStack_20) && (!NAN(dVar2) && !NAN(dStack_20))) {
        return;
      }
    }
    iVar1 = QFont::pixelSize();
    dStack_20 = dVar2;
    if (iVar1 == 1) {
      return;
    }
  } while( true );
}

Assistant:

void FontScaler::setFactorForHeight(qreal wantedHeight)
{
#ifdef DEBUG_LAYOUT
    qDebug() << " FontScaler::setFactorForHeight" << wantedHeight;
#endif
    Q_ASSERT(wantedHeight > 0);
    qreal height = m_fontMetrics.height();
    int iterations = 0;

    while (height > wantedHeight && height > 3.0 /* seems to be the min we can get */) {
        const qreal factor = wantedHeight / height;
        applyAdditionalScalingFactor(factor);
        qreal prevHeight = height;
        height = m_fontMetrics.height();
#ifdef DEBUG_LAYOUT
        qDebug() << " FontScaler: height=" << height << factor << m_scalingFactor;
#endif
        if (++iterations > 10 && height == prevHeight) {
            // We're not getting anywhere, probably we're hitting a minimum width when
            // trying to use a very, very small font (see unittest testFontScalerVerySmall)
            break;
        }
        if (m_font.pixelSize() == 1) {
            break;
        }
    }
}